

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O3

void xm_envelope_calculate_value(IT_ENVELOPE *envelope,IT_PLAYING_ENVELOPE *pe)

{
  char cVar1;
  ushort uVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  
  uVar3 = pe->next_node;
  lVar4 = (long)(int)uVar3;
  if (lVar4 < 1) {
    cVar1 = envelope->node_y[0];
  }
  else {
    if (uVar3 < envelope->n_nodes) {
      iVar5 = envelope->node_y[uVar3 - 1] * 0x100;
      uVar2 = envelope->node_t[uVar3 - 1];
      if (uVar2 != envelope->node_t[lVar4]) {
        iVar5 = iVar5 + (int)((pe->tick - (uint)uVar2) *
                              ((int)envelope->node_y[lVar4] - (int)envelope->node_y[uVar3 - 1]) *
                             0x100) / (int)((uint)envelope->node_t[lVar4] - (uint)uVar2);
      }
      goto LAB_005b6147;
    }
    cVar1 = envelope->node_y[(ulong)envelope->n_nodes - 1];
  }
  iVar5 = (int)cVar1 << 8;
LAB_005b6147:
  pe->value = iVar5;
  return;
}

Assistant:

static void xm_envelope_calculate_value(IT_ENVELOPE *envelope, IT_PLAYING_ENVELOPE *pe)
{
	if (pe->next_node <= 0)
		pe->value = envelope->node_y[0] << IT_ENVELOPE_SHIFT;
	else if (pe->next_node >= envelope->n_nodes)
		pe->value = envelope->node_y[envelope->n_nodes-1] << IT_ENVELOPE_SHIFT;
	else {
		int ys = envelope->node_y[pe->next_node-1] << IT_ENVELOPE_SHIFT;
		int ts = envelope->node_t[pe->next_node-1];
		int te = envelope->node_t[pe->next_node];

		if (ts == te)
			pe->value = ys;
		else {
			int ye = envelope->node_y[pe->next_node] << IT_ENVELOPE_SHIFT;
			int t = pe->tick;

			pe->value = ys + (ye - ys) * (t - ts) / (te - ts);
		}
	}
}